

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O3

void TIFFSwabShort(uint16_t *wp)

{
  *wp = *wp << 8 | *wp >> 8;
  return;
}

Assistant:

void TIFFSwabShort(uint16_t *wp)
{
    register unsigned char *cp = (unsigned char *)wp;
    unsigned char t;
    assert(sizeof(uint16_t) == 2);
    t = cp[1];
    cp[1] = cp[0];
    cp[0] = t;
}